

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnni.cpp
# Opt level: O2

void ncnn::transpose_pack_B_tile_int8_avxvnni(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  undefined1 (*pauVar4) [32];
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  undefined1 *puVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM4 [64];
  long local_98;
  long local_88;
  
  iVar2 = cpu_support_x86_avx_vnni_int8();
  if (iVar2 == 0) {
    iVar2 = B->w;
    lVar3 = (long)iVar2;
    pauVar4 = (undefined1 (*) [32])BT->data;
    lVar5 = (long)k;
    lVar21 = (long)(iVar2 * 2);
    lVar12 = (long)(iVar2 * 4);
    lVar11 = (long)j;
    lVar6 = (long)max_jj;
    lVar18 = iVar2 * 3 + lVar11;
    local_88 = lVar11 + lVar21;
    local_98 = lVar3 + lVar11;
    lVar13 = (iVar2 * 3 + 1) + lVar11;
    lVar20 = (iVar2 + 1) + lVar11;
    lVar16 = (iVar2 + 3) + lVar11;
    lVar7 = (iVar2 + 2) + lVar11;
    auVar26[8] = 0x7f;
    auVar26._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar26[9] = 0x7f;
    auVar26[10] = 0x7f;
    auVar26[0xb] = 0x7f;
    auVar26[0xc] = 0x7f;
    auVar26[0xd] = 0x7f;
    auVar26[0xe] = 0x7f;
    auVar26[0xf] = 0x7f;
    auVar26[0x10] = 0x7f;
    auVar26[0x11] = 0x7f;
    auVar26[0x12] = 0x7f;
    auVar26[0x13] = 0x7f;
    auVar26[0x14] = 0x7f;
    auVar26[0x15] = 0x7f;
    auVar26[0x16] = 0x7f;
    auVar26[0x17] = 0x7f;
    auVar26[0x18] = 0x7f;
    auVar26[0x19] = 0x7f;
    auVar26[0x1a] = 0x7f;
    auVar26[0x1b] = 0x7f;
    auVar26[0x1c] = 0x7f;
    auVar26[0x1d] = 0x7f;
    auVar26[0x1e] = 0x7f;
    auVar26[0x1f] = 0x7f;
    for (uVar22 = 0; auVar27 = _DAT_005359a0, (long)(uVar22 | 7) < lVar6; uVar22 = uVar22 + 8) {
      pvVar1 = B->data;
      lVar14 = B->w * lVar5 * B->elemsize;
      lVar8 = (long)pvVar1 + lVar11;
      lVar19 = lVar18 + (long)pvVar1;
      lVar24 = (long)pvVar1 + local_88;
      lVar17 = (long)pvVar1 + local_98;
      for (iVar10 = 0; iVar10 + 3 < max_kk; iVar10 = iVar10 + 4) {
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)(lVar8 + lVar14);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(lVar17 + lVar14);
        auVar27 = vpunpcklbw_avx(auVar27,auVar30);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)(lVar24 + lVar14);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)(lVar19 + lVar14);
        auVar30 = vpunpcklbw_avx(auVar31,auVar34);
        auVar31 = vpunpcklwd_avx(auVar27,auVar30);
        auVar27 = vpunpckhwd_avx(auVar27,auVar30);
        auVar29._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar31;
        auVar29._16_16_ = ZEXT116(1) * auVar27;
        auVar29 = vpaddb_avx2(auVar29,auVar26);
        *pauVar4 = auVar29;
        pauVar4 = pauVar4 + 1;
        lVar8 = lVar8 + lVar12;
        lVar19 = lVar19 + lVar12;
        lVar24 = lVar24 + lVar12;
        lVar17 = lVar17 + lVar12;
      }
      for (; iVar10 + 1 < max_kk; iVar10 = iVar10 + 2) {
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)(lVar8 + lVar14);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)(lVar17 + lVar14);
        auVar27 = vpunpcklbw_avx(auVar28,auVar32);
        *(undefined1 (*) [16])*pauVar4 = auVar27;
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + 0x10);
        lVar8 = lVar8 + lVar21;
        lVar17 = lVar17 + lVar21;
      }
      puVar9 = (undefined8 *)(lVar8 + lVar14);
      for (; iVar10 < max_kk; iVar10 = iVar10 + 1) {
        *(undefined8 *)*pauVar4 = *puVar9;
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + 8);
        puVar9 = (undefined8 *)((long)puVar9 + lVar3);
      }
      lVar11 = lVar11 + 8;
      lVar18 = lVar18 + 8;
      local_88 = local_88 + 8;
      local_98 = local_98 + 8;
      lVar13 = lVar13 + 8;
      lVar20 = lVar20 + 8;
      lVar16 = lVar16 + 8;
      lVar7 = lVar7 + 8;
    }
    auVar25._4_4_ = iVar2;
    auVar25._0_4_ = iVar2;
    auVar25._8_4_ = iVar2;
    auVar25._12_4_ = iVar2;
    vpmulld_avx(auVar25,_DAT_00535560);
    auVar33[8] = 0x7f;
    auVar33._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar33[9] = 0x7f;
    auVar33[10] = 0x7f;
    auVar33[0xb] = 0x7f;
    auVar33[0xc] = 0x7f;
    auVar33[0xd] = 0x7f;
    auVar33[0xe] = 0x7f;
    auVar33[0xf] = 0x7f;
    for (; (long)(uVar22 | 3) < lVar6; uVar22 = uVar22 + 4) {
      pvVar1 = B->data;
      lVar15 = B->w * lVar5 * B->elemsize;
      lVar8 = lVar11 + (long)pvVar1;
      lVar24 = lVar16 + (long)pvVar1;
      lVar14 = lVar7 + (long)pvVar1;
      lVar17 = lVar20 + (long)pvVar1;
      lVar19 = (long)pvVar1 + local_98;
      iVar2 = 1;
      for (iVar10 = 0; iVar10 + 3 < max_kk; iVar10 = iVar10 + 4) {
        auVar30 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
        auVar30 = vpgatherdd((undefined1  [16])0x0,auVar30);
        in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
        auVar30 = vpshufb_avx(auVar30,auVar27);
        auVar30 = vpaddb_avx(auVar30,auVar33);
        *(undefined1 (*) [16])*pauVar4 = auVar30;
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + 0x10);
        lVar8 = lVar8 + lVar12;
        lVar24 = lVar24 + lVar12;
        lVar14 = lVar14 + lVar12;
        lVar17 = lVar17 + lVar12;
        iVar2 = iVar2 + 4;
        lVar19 = lVar19 + lVar12;
      }
      for (; iVar2 < max_kk; iVar2 = iVar2 + 2) {
        (*pauVar4)[0] = *(undefined1 *)(lVar8 + lVar15);
        (*pauVar4)[1] = *(undefined1 *)(lVar19 + lVar15);
        (*pauVar4)[2] = *(undefined1 *)(lVar8 + 1 + lVar15);
        (*pauVar4)[3] = *(undefined1 *)(lVar17 + lVar15);
        (*pauVar4)[4] = *(undefined1 *)(lVar8 + 2 + lVar15);
        (*pauVar4)[5] = *(undefined1 *)(lVar14 + lVar15);
        (*pauVar4)[6] = *(undefined1 *)(lVar8 + 3 + lVar15);
        (*pauVar4)[7] = *(undefined1 *)(lVar24 + lVar15);
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + 8);
        lVar8 = lVar8 + lVar21;
        lVar24 = lVar24 + lVar21;
        lVar14 = lVar14 + lVar21;
        lVar17 = lVar17 + lVar21;
        lVar19 = lVar19 + lVar21;
      }
      puVar23 = (undefined1 *)(lVar8 + lVar15);
      for (iVar2 = iVar2 + -1; iVar2 < max_kk; iVar2 = iVar2 + 1) {
        (*pauVar4)[0] = *puVar23;
        (*pauVar4)[1] = puVar23[1];
        (*pauVar4)[2] = puVar23[2];
        (*pauVar4)[3] = puVar23[3];
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + 4);
        puVar23 = puVar23 + lVar3;
      }
      lVar11 = lVar11 + 4;
      lVar18 = lVar18 + 4;
      local_88 = local_88 + 4;
      local_98 = local_98 + 4;
      lVar13 = lVar13 + 4;
      lVar20 = lVar20 + 4;
      lVar16 = lVar16 + 4;
      lVar7 = lVar7 + 4;
    }
    for (; (long)(uVar22 | 1) < lVar6; uVar22 = uVar22 + 2) {
      pvVar1 = B->data;
      lVar17 = B->w * lVar5 * B->elemsize;
      lVar7 = lVar11 + (long)pvVar1;
      lVar16 = lVar13 + (long)pvVar1;
      lVar14 = (long)pvVar1 + lVar20;
      lVar8 = lVar18 + (long)pvVar1;
      lVar24 = local_88 + (long)pvVar1;
      lVar19 = (long)pvVar1 + local_98;
      iVar2 = 1;
      for (iVar10 = 3; iVar10 < max_kk; iVar10 = iVar10 + 4) {
        (*pauVar4)[0] = *(char *)(lVar7 + lVar17) + '\x7f';
        (*pauVar4)[1] = *(char *)(lVar19 + lVar17) + '\x7f';
        (*pauVar4)[2] = *(char *)(lVar24 + lVar17) + '\x7f';
        (*pauVar4)[3] = *(char *)(lVar8 + lVar17) + '\x7f';
        (*pauVar4)[4] = *(char *)(lVar7 + 1 + lVar17) + '\x7f';
        (*pauVar4)[5] = *(char *)(lVar14 + lVar17) + '\x7f';
        (*pauVar4)[6] = *(char *)(lVar24 + 1 + lVar17) + '\x7f';
        (*pauVar4)[7] = *(char *)(lVar16 + lVar17) + '\x7f';
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + 8);
        lVar7 = lVar7 + lVar12;
        lVar16 = lVar16 + lVar12;
        lVar14 = lVar14 + lVar12;
        lVar8 = lVar8 + lVar12;
        lVar24 = lVar24 + lVar12;
        lVar19 = lVar19 + lVar12;
        iVar2 = iVar2 + 4;
      }
      for (; iVar2 < max_kk; iVar2 = iVar2 + 2) {
        (*pauVar4)[0] = *(undefined1 *)(lVar7 + lVar17);
        (*pauVar4)[1] = *(undefined1 *)(lVar19 + lVar17);
        (*pauVar4)[2] = *(undefined1 *)(lVar7 + 1 + lVar17);
        (*pauVar4)[3] = *(undefined1 *)(lVar14 + lVar17);
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + 4);
        lVar7 = lVar7 + lVar21;
        lVar14 = lVar14 + lVar21;
        lVar19 = lVar19 + lVar21;
      }
      for (iVar2 = iVar2 + -1; iVar2 < max_kk; iVar2 = iVar2 + 1) {
        (*pauVar4)[0] = *(undefined1 *)(lVar7 + lVar17);
        (*pauVar4)[1] = *(undefined1 *)(lVar7 + 1 + lVar17);
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + 2);
        lVar17 = lVar17 + lVar3;
      }
      lVar11 = lVar11 + 2;
      lVar18 = lVar18 + 2;
      local_88 = local_88 + 2;
      local_98 = local_98 + 2;
      lVar13 = lVar13 + 2;
      lVar20 = lVar20 + 2;
    }
    for (; (long)uVar22 < lVar6; uVar22 = uVar22 + 1) {
      pvVar1 = B->data;
      lVar20 = B->w * lVar5 * B->elemsize;
      lVar16 = lVar11 + (long)pvVar1;
      lVar8 = lVar18 + (long)pvVar1;
      lVar7 = (long)pvVar1 + local_88;
      lVar21 = (long)pvVar1 + local_98;
      for (lVar13 = 0; (int)lVar13 + 3 < max_kk; lVar13 = lVar13 + 4) {
        (*pauVar4)[lVar13] = *(char *)(lVar16 + lVar20) + '\x7f';
        (*pauVar4)[lVar13 + 1] = *(char *)(lVar21 + lVar20) + '\x7f';
        (*pauVar4)[lVar13 + 2] = *(char *)(lVar7 + lVar20) + '\x7f';
        (*pauVar4)[lVar13 + 3] = *(char *)(lVar8 + lVar20) + '\x7f';
        lVar16 = lVar16 + lVar12;
        lVar8 = lVar8 + lVar12;
        lVar7 = lVar7 + lVar12;
        lVar21 = lVar21 + lVar12;
      }
      puVar23 = (undefined1 *)(lVar16 + lVar20);
      for (; (int)lVar13 < max_kk; lVar13 = lVar13 + 1) {
        (*pauVar4)[lVar13] = *puVar23;
        puVar23 = puVar23 + lVar3;
      }
      lVar11 = lVar11 + 1;
      lVar18 = lVar18 + 1;
      local_88 = local_88 + 1;
      local_98 = local_98 + 1;
      pauVar4 = (undefined1 (*) [32])(*pauVar4 + lVar13);
    }
    return;
  }
  transpose_pack_B_tile_int8_avxvnniint8(B,BT,j,max_jj,k,max_kk);
  return;
}

Assistant:

void transpose_pack_B_tile_int8_avxvnni(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    transpose_pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}